

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__tesselate_cubic
               (stbtt__point *points,int *num_points,float x0,float y0,float x1,float y1,float x2,
               float y2,float x3,float y3,float objspace_flatness_squared,int n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float x2_00;
  float y2_00;
  float x2_01;
  float y2_01;
  float x3_00;
  float y3_00;
  float my;
  float mx;
  float yb;
  float xb;
  float ya;
  float xa;
  float y23;
  float x23;
  float y12;
  float x12;
  float y01;
  float x01;
  float flatness_squared;
  float shortlen;
  float longlen;
  float dy;
  float dx;
  float dy2;
  float dx2;
  float dy1;
  float dx1;
  float dy0;
  float dx0;
  int n_local;
  float y3_local;
  float x3_local;
  float y2_local;
  float x2_local;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  int *num_points_local;
  stbtt__point *points_local;
  
  fVar1 = sqrtf((x1 - x0) * (x1 - x0) + (y1 - y0) * (y1 - y0));
  fVar2 = sqrtf((x2 - x1) * (x2 - x1) + (y2 - y1) * (y2 - y1));
  fVar3 = sqrtf((x3 - x2) * (x3 - x2) + (y3 - y2) * (y3 - y2));
  fVar3 = fVar1 + fVar2 + fVar3;
  fVar1 = sqrtf((x3 - x0) * (x3 - x0) + (y3 - y0) * (y3 - y0));
  if (n < 0x11) {
    if (fVar3 * fVar3 + -(fVar1 * fVar1) <= objspace_flatness_squared) {
      stbtt__add_point(points,*num_points,x3,y3);
      *num_points = *num_points + 1;
    }
    else {
      fVar1 = (x0 + x1) / 2.0;
      fVar2 = (y0 + y1) / 2.0;
      fVar3 = (x1 + x2) / 2.0;
      fVar4 = (y1 + y2) / 2.0;
      x2_00 = (x2 + x3) / 2.0;
      y2_00 = (y2 + y3) / 2.0;
      x2_01 = (fVar1 + fVar3) / 2.0;
      y2_01 = (fVar2 + fVar4) / 2.0;
      fVar3 = (fVar3 + x2_00) / 2.0;
      fVar4 = (fVar4 + y2_00) / 2.0;
      x3_00 = (x2_01 + fVar3) / 2.0;
      y3_00 = (y2_01 + fVar4) / 2.0;
      stbtt__tesselate_cubic
                (points,num_points,x0,y0,fVar1,fVar2,x2_01,y2_01,x3_00,y3_00,
                 objspace_flatness_squared,n + 1);
      stbtt__tesselate_cubic
                (points,num_points,x3_00,y3_00,fVar3,fVar4,x2_00,y2_00,x3,y3,
                 objspace_flatness_squared,n + 1);
    }
  }
  return;
}

Assistant:

static void stbtt__tesselate_cubic(stbtt__point *points, int *num_points, float x0, float y0, float x1, float y1, float x2, float y2, float x3, float y3, float objspace_flatness_squared, int n)
{
   // @TODO this "flatness" calculation is just made-up nonsense that seems to work well enough
   float dx0 = x1-x0;
   float dy0 = y1-y0;
   float dx1 = x2-x1;
   float dy1 = y2-y1;
   float dx2 = x3-x2;
   float dy2 = y3-y2;
   float dx = x3-x0;
   float dy = y3-y0;
   float longlen = (float) (STBTT_sqrt(dx0*dx0+dy0*dy0)+STBTT_sqrt(dx1*dx1+dy1*dy1)+STBTT_sqrt(dx2*dx2+dy2*dy2));
   float shortlen = (float) STBTT_sqrt(dx*dx+dy*dy);
   float flatness_squared = longlen*longlen-shortlen*shortlen;

   if (n > 16) // 65536 segments on one curve better be enough!
      return;

   if (flatness_squared > objspace_flatness_squared) {
      float x01 = (x0+x1)/2;
      float y01 = (y0+y1)/2;
      float x12 = (x1+x2)/2;
      float y12 = (y1+y2)/2;
      float x23 = (x2+x3)/2;
      float y23 = (y2+y3)/2;

      float xa = (x01+x12)/2;
      float ya = (y01+y12)/2;
      float xb = (x12+x23)/2;
      float yb = (y12+y23)/2;

      float mx = (xa+xb)/2;
      float my = (ya+yb)/2;

      stbtt__tesselate_cubic(points, num_points, x0,y0, x01,y01, xa,ya, mx,my, objspace_flatness_squared,n+1);
      stbtt__tesselate_cubic(points, num_points, mx,my, xb,yb, x23,y23, x3,y3, objspace_flatness_squared,n+1);
   } else {
      stbtt__add_point(points, *num_points,x3,y3);
      *num_points = *num_points+1;
   }
}